

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O2

void Macro_smpsChanTempoDiv(uint arg_count,long *arg_array)

{
  uchar value;
  
  if (arg_count == 0) {
    __assert_fail("arg_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                  ,0x234,"void Macro_smpsChanTempoDiv(unsigned int, long *)");
  }
  if (target_driver < 5) {
    if (2 < target_driver) {
      PrintError(
                "Error: Coord. Flag to set tempo divider of a single channel does not exist in S3 driver. Use Flamewing\'s modified S&K sound driver instead.\n"
                );
      return;
    }
    value = 0xe5;
  }
  else {
    WriteByte(0xff);
    value = '\b';
  }
  WriteByte(value);
  WriteByte((uchar)*arg_array);
  return;
}

Assistant:

static void Macro_smpsChanTempoDiv(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	if (target_driver >= 5)
	{
		WriteByte(0xFF);
		WriteByte(0x08);
		WriteByte(arg_array[0]);
	}
	else if (target_driver >= 3)
	{
		PrintError("Error: Coord. Flag to set tempo divider of a single channel does not exist in S3 driver. Use Flamewing's modified S&K sound driver instead.\n");
	}
	else
	{
		WriteByte(0xE5);
		WriteByte(arg_array[0]);
	}
}